

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

int __thiscall
FNodeBuilder::FVertexMapSimple::SelectVertexClose(FVertexMapSimple *this,FPrivVert *vert)

{
  FPrivVert *pFVar1;
  FNodeBuilder *pFVar2;
  DWORD DVar3;
  DWORD DVar4;
  ulong uVar5;
  ulong uVar6;
  fixed_t *pfVar7;
  uint uVar8;
  uint uVar9;
  
  pFVar2 = this->MyBuilder;
  uVar6 = (ulong)(pFVar2->Vertices).Count;
  if (uVar6 != 0) {
    pfVar7 = &(((pFVar2->Vertices).Array)->super_FSimpleVert).y;
    uVar5 = 0;
    do {
      uVar8 = ((FSimpleVert *)(pfVar7 + -1))->x - (vert->super_FSimpleVert).x;
      uVar9 = -uVar8;
      if (0 < (int)uVar8) {
        uVar9 = uVar8;
      }
      if (uVar9 < 6) {
        uVar8 = *pfVar7 - (vert->super_FSimpleVert).y;
        uVar9 = -uVar8;
        if (0 < (int)uVar8) {
          uVar9 = uVar8;
        }
        if (uVar9 < 6) goto LAB_003aa5da;
      }
      uVar5 = uVar5 + 1;
      pfVar7 = pfVar7 + 4;
    } while (uVar6 != uVar5);
  }
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Grow(&pFVar2->Vertices,1);
  DVar3 = vert->segs;
  DVar4 = vert->segs2;
  pFVar1 = (pFVar2->Vertices).Array + (pFVar2->Vertices).Count;
  pFVar1->super_FSimpleVert = vert->super_FSimpleVert;
  pFVar1->segs = DVar3;
  pFVar1->segs2 = DVar4;
  uVar9 = (pFVar2->Vertices).Count;
  uVar5 = (ulong)uVar9;
  (pFVar2->Vertices).Count = uVar9 + 1;
LAB_003aa5da:
  return (int)uVar5;
}

Assistant:

int FNodeBuilder::FVertexMapSimple::SelectVertexClose(FNodeBuilder::FPrivVert &vert)
{
	FPrivVert *verts = &MyBuilder.Vertices[0];
	unsigned int stop = MyBuilder.Vertices.Size();

	for (unsigned int i = 0; i < stop; ++i)
	{
#if VERTEX_EPSILON <= 1
		if (verts[i].x == vert.x && verts[i].y == y)
#else
		if (abs(verts[i].x - vert.x) < VERTEX_EPSILON &&
			abs(verts[i].y - vert.y) < VERTEX_EPSILON)
#endif
		{
			return i;
		}
	}
	// Not present: add it!
	return InsertVertex (vert);
}